

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_htmlAutoCloseTag(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_68;
  PyObject *local_60;
  undefined *local_58;
  PyObject *pyobj_elem;
  htmlNodePtr elem;
  xmlChar *name;
  PyObject *pyobj_doc;
  htmlDocPtr doc;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("htmlAutoCloseTag");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"OzO:htmlAutoCloseTag",&name,&elem,&local_58);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (name == &_Py_NoneStruct) {
        local_60 = (PyObject *)0x0;
      }
      else {
        local_60 = *(PyObject **)(name + 0x10);
      }
      pyobj_doc = local_60;
      if (local_58 == &_Py_NoneStruct) {
        local_68 = (PyObject *)0x0;
      }
      else {
        local_68 = *(PyObject **)(local_58 + 0x10);
      }
      pyobj_elem = local_68;
      doc._4_4_ = htmlAutoCloseTag(local_60,elem,local_68);
      self_local = libxml_intWrap(doc._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_htmlAutoCloseTag(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    htmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlChar * name;
    htmlNodePtr elem;
    PyObject *pyobj_elem;

    if (libxml_deprecationWarning("htmlAutoCloseTag") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OzO:htmlAutoCloseTag", &pyobj_doc, &name, &pyobj_elem))
        return(NULL);
    doc = (htmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (htmlNodePtr) PyxmlNode_Get(pyobj_elem);

    c_retval = htmlAutoCloseTag(doc, name, elem);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}